

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall DifferingTypesTest::constructionTest(DifferingTypesTest *this)

{
  short sVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  reference psVar7;
  reference piVar8;
  bool local_281;
  ulong local_280;
  size_t j_2;
  undefined1 local_270 [8];
  Marray<int,_std::allocator<unsigned_long>_> n;
  undefined1 local_220 [8];
  Marray<short,_std::allocator<unsigned_long>_> m_2;
  size_t shape_2 [3];
  bool local_1b1;
  ulong local_1b0;
  size_t j_1;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_1a0;
  undefined1 local_188 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_1;
  undefined1 local_138 [8];
  View<short,_false,_std::allocator<unsigned_long>_> v_1;
  size_t shape_1 [3];
  size_t local_d8;
  size_t j;
  undefined1 local_c8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator<short> local_69;
  undefined1 local_68 [8];
  View<short,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  DifferingTypesTest *this_local;
  
  v.geometry_.coordinateOrder_ = 3;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  shape[0] = 2;
  shape[1] = 4;
  shape[2] = (size_t)this;
  std::allocator<short>::allocator(&local_69);
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)local_68,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->dataShort_,
             &andres::defaultOrder,&andres::defaultOrder,&local_69);
  std::allocator<short>::~allocator(&local_69);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<short,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_c8,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_68);
  sVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  j._7_1_ = sVar5 == sVar6;
  test((bool *)((long)&j + 7));
  local_d8 = 0;
  while( true ) {
    sVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68);
    if (sVar5 <= local_d8) break;
    psVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68,local_d8);
    sVar1 = *psVar7;
    piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,local_d8);
    shape_1[2]._7_1_ = (int)sVar1 == *piVar8;
    test((bool *)((long)shape_1 + 0x17));
    local_d8 = local_d8 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::~View
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68);
  v_1.geometry_.coordinateOrder_ = 3;
  v_1.geometry_.isSimple_ = false;
  v_1.geometry_._53_3_ = 0;
  shape_1[0] = 2;
  shape_1[1] = 4;
  std::allocator<short>::allocator((allocator<short> *)&m_1.field_0x47);
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)local_138,
             (unsigned_long *)&v_1.geometry_.coordinateOrder_,shape_1 + 2,this->dataShort_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&m_1.field_0x47);
  std::allocator<short>::~allocator((allocator<short> *)&m_1.field_0x47);
  andres::operator+(&local_1a0,
                    (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                     *)local_138,
                    (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                     *)local_138);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_1 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
            ((Marray<int,std::allocator<unsigned_long>> *)local_188,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&local_1a0,(allocator<int> *)((long)&j_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_1 + 7));
  sVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)local_138);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_188);
  j_1._6_1_ = sVar5 == sVar6;
  test((bool *)((long)&j_1 + 6));
  local_1b0 = 0;
  while( true ) {
    uVar4 = local_1b0;
    sVar5 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)local_138);
    if (sVar5 <= uVar4) break;
    psVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_138,local_1b0);
    sVar1 = *psVar7;
    psVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_138,local_1b0);
    sVar2 = *psVar7;
    piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_188,local_1b0);
    local_1b1 = (int)sVar1 + (int)sVar2 == *piVar8;
    test(&local_1b1);
    local_1b0 = local_1b0 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_188);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::~View
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_138);
  m_2._64_8_ = 3;
  shape_2[0] = 2;
  shape_2[1] = 4;
  n._70_2_ = 0;
  std::allocator<short>::allocator((allocator<short> *)&n.field_0x45);
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)local_220,
             (unsigned_long *)&m_2.field_0x40,shape_2 + 2,(short *)&n.field_0x46,
             &andres::defaultOrder,(allocator_type *)&n.field_0x45);
  std::allocator<short>::~allocator((allocator<short> *)&n.field_0x45);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<short,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_270,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_220);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_270);
  sVar6 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)local_220);
  j_2._7_1_ = sVar5 == sVar6;
  test((bool *)((long)&j_2 + 7));
  local_280 = 0;
  while( true ) {
    uVar4 = local_280;
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_270);
    if (sVar5 <= uVar4) break;
    piVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_270,local_280);
    iVar3 = *piVar8;
    psVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_220,local_280);
    local_281 = iVar3 == *psVar7;
    test(&local_281);
    local_280 = local_280 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_270);
  andres::Marray<short,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<short,_std::allocator<unsigned_long>_> *)local_220);
  return;
}

Assistant:

void DifferingTypesTest::constructionTest()
{
    // Marray
    {
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m(v);
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m(v + v);
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n(m);
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}